

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

void __thiscall slang::SourceManager::addSystemDirectory(SourceManager *this,string_view path)

{
  unique_lock<std::shared_mutex> lock;
  unique_lock<std::shared_mutex> local_90;
  path local_80;
  path local_58;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_90._M_owns = false;
  local_90._M_device = &this->mut;
  std::unique_lock<std::shared_mutex>::lock(&local_90);
  local_90._M_owns = true;
  local_30._M_len = path._M_len;
  local_30._M_str = path._M_str;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_80,&local_30,auto_format);
  std::filesystem::canonical(&local_58);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  emplace_back<std::filesystem::__cxx11::path>(&this->systemDirectories,&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::__cxx11::path::~path(&local_80);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_90);
  return;
}

Assistant:

void SourceManager::addSystemDirectory(string_view path) {
    std::unique_lock lock(mut);
    systemDirectories.push_back(fs::canonical(widen(path)));
}